

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O3

void __thiscall TestSuite::~TestSuite(TestSuite *this)

{
  pointer pcVar1;
  ulong uVar2;
  size_t sVar3;
  double dVar4;
  undefined1 auVar5 [16];
  string time_str;
  string local_38;
  
  auVar5 = std::chrono::_V2::system_clock::now();
  dVar4 = ((double)(auVar5._0_8_ - (this->startTimeGlobal).__d.__r) / 1000000000.0) * 1000000.0;
  uVar2 = (ulong)dVar4;
  usToString_abi_cxx11_
            (&local_38,
             (TestSuite *)((long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2),
             auVar5._8_8_);
  sVar3 = 0;
  printf("\x1b[32m%zu\x1b[0m tests passed",this->cntPass);
  if (this->cntFail != 0) {
    printf(", \x1b[31m%zu\x1b[0m tests failed");
    sVar3 = this->cntFail;
  }
  printf(" out of \x1b[36m%zu\x1b[0m (\x1b[33m%s\x1b[0m)\n",sVar3 + this->cntPass,
         local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  pcVar1 = (this->filter)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filter).field_2) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

~TestSuite() {
        std::chrono::time_point<std::chrono::system_clock> cur_time =
                std::chrono::system_clock::now();;
        std::chrono::duration<double> elapsed = cur_time - startTimeGlobal;
        std::string time_str = usToString
                               ( (uint64_t)(elapsed.count() * 1000000) );

        printf(_CL_GREEN("%zu") " tests passed", cntPass);
        if (cntFail) {
            printf(", " _CL_RED("%zu") " tests failed", cntFail);
        }
        printf(" out of " _CL_CYAN("%zu") " (" _CL_BROWN("%s") ")\n",
               cntPass+cntFail, time_str.c_str());
    }